

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O3

void __thiscall BibIndexer::publishErrors(BibIndexer *this)

{
  pointer pBVar1;
  pointer pcVar2;
  pointer pBVar3;
  BibEntryIssue issue;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_110;
  undefined1 local_d0 [32];
  Severity SStack_b0;
  int iStack_ac;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_68;
  
  local_110.os_ = &local_68;
  local_68.stack_.stack_ = (char *)0x0;
  local_68.stack_.stackTop_ = (char *)0x0;
  local_68.stack_.allocator_ = (CrtAllocator *)0x0;
  local_68.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_68.stack_.stackEnd_ = (char *)0x0;
  local_68.stack_.initialCapacity_ = 0x100;
  local_110.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_110.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_110.level_stack_.stack_ = (char *)0x0;
  local_110.level_stack_.stackTop_ = (char *)0x0;
  local_110.level_stack_.stackEnd_ = (char *)0x0;
  local_110.level_stack_.initialCapacity_ = 0x200;
  local_110.maxDecimalPlaces_ = 0x144;
  local_110.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_110);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"jsonrpc",7,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"2.0",3,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"method",6,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"textDocument/publishDiagnostics",0x1f,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"params",6,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_110);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"uri",3,false);
  File::getPath_abi_cxx11_((string *)local_d0,this->file);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,(Ch *)local_d0._0_8_,local_d0._8_4_,false);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,CONCAT44(local_d0._20_4_,local_d0._16_4_) + 1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_110,"diagnostics",0xb,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&local_110);
  pBVar3 = (this->issues).super__Vector_base<BibEntryIssue,_std::allocator<BibEntryIssue>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (this->issues).super__Vector_base<BibEntryIssue,_std::allocator<BibEntryIssue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar1) {
    do {
      local_d0._0_8_ = &PTR_reflect_00216cd8;
      local_d0._8_4_ = (pBVar3->range).start_point.row;
      local_d0._12_4_ = (pBVar3->range).start_point.column;
      local_d0._16_4_ = (pBVar3->range).end_point.row;
      local_d0._20_4_ = (pBVar3->range).end_point.column;
      local_d0._24_4_ = (pBVar3->range).start_byte;
      local_d0._28_4_ = (pBVar3->range).end_byte;
      SStack_b0 = pBVar3->severity;
      iStack_ac = pBVar3->code;
      pcVar2 = (pBVar3->message)._M_dataplus._M_p;
      local_a8._M_p = (pointer)&local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + (pBVar3->message)._M_string_length);
      pcVar2 = (pBVar3->source)._M_dataplus._M_p;
      local_88._M_p = (pointer)&local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (pBVar3->source)._M_string_length);
      BibEntryIssue::reflect((BibEntryIssue *)local_d0,&local_110);
      local_d0._0_8_ = &PTR_reflect_00216cd8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
      }
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != pBVar1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&local_110,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_110,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_110,0);
  sendMessage(&local_68);
  free(local_110.level_stack_.stack_);
  operator_delete(local_110.level_stack_.ownAllocator_,1);
  free(local_68.stack_.stack_);
  operator_delete(local_68.stack_.ownAllocator_,1);
  return;
}

Assistant:

void BibIndexer::publishErrors () {
    INIT_WRITER

    ADD_METHOD("textDocument/publishDiagnostics");

    writer.Key("params"); writer.StartObject();
        writer.Key("uri"); writer.String(file->getPath());
        writer.Key("diagnostics"); writer.StartArray();
            for (auto issue : issues) {
                issue.reflect(writer);
            }
        writer.EndArray();
    writer.EndObject();

    SEND_MESSAGE
}